

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O1

void __thiscall
de::AppendList<de::(anonymous_namespace)::ObjCountElem>::append
          (AppendList<de::(anonymous_namespace)::ObjCountElem> *this,ObjCountElem *value)

{
  size_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  int *piVar4;
  ulong uVar5;
  Block *pBVar6;
  ObjCountElem *pOVar7;
  ulong uVar8;
  Block *pBVar9;
  
  pBVar9 = this->m_last;
  LOCK();
  psVar1 = &this->m_numElements;
  uVar8 = *psVar1;
  *psVar1 = *psVar1 + 1;
  UNLOCK();
  uVar5 = uVar8 / this->m_blockSize;
  uVar8 = uVar8 % this->m_blockSize;
  uVar2 = pBVar9->blockNdx;
  while (uVar2 != uVar5) {
    if (pBVar9->next == (Block *)0x0) {
      deYield();
    }
    else {
      pBVar9 = pBVar9->next;
    }
    uVar2 = pBVar9->blockNdx;
  }
  sVar3 = this->m_blockSize;
  if (uVar8 + 1 == sVar3) {
    pBVar6 = (Block *)operator_new(0x18);
    pBVar6->blockNdx = uVar5 + 1;
    pOVar7 = (ObjCountElem *)deAlignedMalloc(sVar3 << 3,8);
    pBVar6->elements = pOVar7;
    pBVar6->next = (Block *)0x0;
    this->m_last = pBVar6;
    pBVar9->next = pBVar6;
  }
  piVar4 = value->m_liveCount;
  pBVar9->elements[uVar8].m_liveCount = piVar4;
  *piVar4 = *piVar4 + 1;
  return;
}

Assistant:

void AppendList<ElementType>::append (const ElementType& value)
{
	// Fetch curBlock first before allocating slot. Otherwise m_last might get updated before
	// this thread gets chance of reading it, leading to curBlock->blockNdx > blockNdx.
	Block*			curBlock	= m_last;

	deMemoryReadWriteFence();

	{
		const size_t	elementNdx	= deAtomicIncrementUSize(&m_numElements) - 1;
		const size_t	blockNdx	= elementNdx / m_blockSize;
		const size_t	slotNdx		= elementNdx - (blockNdx * m_blockSize);

		while (curBlock->blockNdx != blockNdx)
		{
			if (curBlock->next)
				curBlock = curBlock->next;
			else
			{
				// Other thread(s) are currently allocating additional block(s)
				deYield();
			}
		}

		// Did we allocate last slot? If so, add a new block
		if (slotNdx+1 == m_blockSize)
		{
			Block* const	newBlock	= new Block(blockNdx+1, m_blockSize);

			deMemoryReadWriteFence();

			// At this point if any other thread is trying to allocate more blocks
			// they are being blocked by curBlock->next being null. This guarantees
			// that this thread has exclusive modify access to m_last.
			m_last = newBlock;
			deMemoryReadWriteFence();

			// At this point other threads might have skipped to newBlock, but we
			// still have exclusive modify access to curBlock->next.
			curBlock->next = newBlock;
			deMemoryReadWriteFence();
		}

		new (&curBlock->elements[slotNdx]) ElementType(value);
	}
}